

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfsfileengine_unix.cpp
# Opt level: O0

bool __thiscall QFSFileEngine::isRelativePath(QFSFileEngine *this)

{
  bool bVar1;
  QFSFileEnginePrivate *this_00;
  long in_FS_OFFSET;
  QFSFileEnginePrivate *d;
  QString fp;
  QChar *in_stack_ffffffffffffffb8;
  undefined6 in_stack_ffffffffffffffc0;
  undefined1 in_stack_ffffffffffffffc6;
  byte bVar2;
  QChar local_24;
  char16_t local_22;
  undefined8 local_20;
  undefined8 local_18;
  undefined8 local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = d_func((QFSFileEngine *)0x17f515);
  local_20 = 0xaaaaaaaaaaaaaaaa;
  local_18 = 0xaaaaaaaaaaaaaaaa;
  local_10 = 0xaaaaaaaaaaaaaaaa;
  QFileSystemEntry::filePath((QFileSystemEntry *)this_00);
  bVar1 = QString::isEmpty((QString *)0x17f55b);
  bVar2 = true;
  if (!bVar1) {
    local_22 = (char16_t)
               QString::at((QString *)this_00,
                           CONCAT17(1,CONCAT16(in_stack_ffffffffffffffc6,in_stack_ffffffffffffffc0))
                          );
    QChar::QChar<char16_t,_true>(&local_24,L'/');
    bVar2 = ::operator!=((QChar *)CONCAT17(bVar2,CONCAT16(in_stack_ffffffffffffffc6,
                                                          in_stack_ffffffffffffffc0)),
                         in_stack_ffffffffffffffb8);
  }
  QString::~QString((QString *)0x17f5af);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return (bool)(bVar2 & 1);
  }
  __stack_chk_fail();
}

Assistant:

bool QFSFileEngine::isRelativePath() const
{
    Q_D(const QFSFileEngine);
    const QString fp = d->fileEntry.filePath();
    return fp.isEmpty() || fp.at(0) != u'/';
}